

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O1

int aom_vector_var_c(int16_t *ref,int16_t *src,int bwl)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  uVar1 = 4 << ((byte)bwl & 0x1f);
  if ((int)uVar1 < 1) {
    iVar3 = 0;
    iVar2 = 0;
  }
  else {
    uVar4 = 0;
    iVar2 = 0;
    iVar3 = 0;
    do {
      iVar5 = (int)ref[uVar4] - (int)src[uVar4];
      iVar3 = iVar3 + iVar5;
      iVar2 = iVar2 + iVar5 * iVar5;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return iVar2 - ((uint)(iVar3 * iVar3) >> ((byte)bwl + 2 & 0x1f));
}

Assistant:

int aom_vector_var_c(const int16_t *ref, const int16_t *src, int bwl) {
  int i;
  int width = 4 << bwl;
  int sse = 0, mean = 0, var;

  for (i = 0; i < width; ++i) {
    int diff = ref[i] - src[i];  // diff: dynamic range [-510, 510], 10 bits.
    mean += diff;                // mean: dynamic range 16 bits.
    sse += diff * diff;          // sse:  dynamic range 26 bits.
  }

  // (mean * mean): dynamic range 31 bits.
  // If width == 128, the mean can be 510 * 128 = 65280, and log2(65280 ** 2) ~=
  // 31.99, so it needs to be casted to unsigned int to compute its square.
  const unsigned int mean_abs = abs(mean);
  var = sse - ((mean_abs * mean_abs) >> (bwl + 2));
  return var;
}